

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14a0b5::preprocessor<baryonyx::problem>::preprocessor
          (preprocessor<baryonyx::problem> *this,context *ctx_,problem *pb_)

{
  vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
  *this_00;
  pointer this_01;
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pcVar2;
  pointer pfVar3;
  iterator iVar4;
  problem *ppVar5;
  allocator_type *__a;
  int iVar6;
  function_element *elem;
  pointer pfVar7;
  int i_2;
  int i_1;
  int i;
  int local_58;
  int local_54;
  int local_50;
  allocator_type local_4b;
  allocator_type local_4a;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  this->ctx = ctx_;
  this->pb = pb_;
  (this->vars)._M_h._M_buckets = &(this->vars)._M_h._M_single_bucket;
  (this->vars)._M_h._M_bucket_count = 1;
  (this->vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars)._M_h._M_element_count = 0;
  (this->vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->equal_constraints,
             ((long)(pb_->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pb_->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->greater_constraints,
             ((long)(this->pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,&local_4a);
  local_48 = &this->less_constraints;
  local_40 = &this->greater_constraints;
  local_38 = &this->equal_constraints;
  std::vector<int,_std::allocator<int>_>::vector
            (local_48,((long)(this->pb->less_constraints).
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->pb->less_constraints).
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             &local_4b);
  this_00 = &this->cache;
  std::
  vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
  ::vector(this_00,((long)(this->pb->vars).values.
                          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->pb->vars).values.
                          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,__a)
  ;
  (this->merge_obj).value = 0.0;
  (this->lifo).data.
  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lifo).data.
  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lifo).data.
  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->merge_obj).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->merge_obj).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->merge_obj).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->merge_obj).value = 0.0;
  local_50 = 0;
  ppVar5 = this->pb;
  iVar6 = (int)((ulong)((long)(ppVar5->equal_constraints).
                              super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ppVar5->equal_constraints).
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  if (iVar6 != 0) {
    do {
      pcVar2 = (this->pb->equal_constraints).
               super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar3 = *(pointer *)
                ((long)&pcVar2[local_50].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      for (pfVar7 = pcVar2[local_50].elements.
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start; pfVar7 != pfVar3; pfVar7 = pfVar7 + 1
          ) {
        this_01 = (this_00->
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  )._M_impl.super__Vector_impl_data._M_start + pfVar7->variable_index;
        iVar4._M_current =
             *(pointer *)
              ((long)&(this_01->in_equal_constraints).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl + 8);
        if (iVar4._M_current ==
            *(pointer *)
             ((long)&(this_01->in_equal_constraints).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)this_01,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = local_50;
          *(int **)((long)&(this_01->in_equal_constraints).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
               iVar4._M_current + 1;
        }
      }
      local_50 = local_50 + 1;
    } while (local_50 != iVar6);
    ppVar5 = this->pb;
  }
  local_54 = 0;
  iVar6 = (int)((ulong)((long)(ppVar5->greater_constraints).
                              super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ppVar5->greater_constraints).
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  if (iVar6 != 0) {
    do {
      pcVar2 = (this->pb->greater_constraints).
               super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar3 = *(pointer *)
                ((long)&pcVar2[local_54].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      for (pfVar7 = pcVar2[local_54].elements.
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start; pfVar7 != pfVar3; pfVar7 = pfVar7 + 1
          ) {
        pvVar1 = &(this_00->
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  )._M_impl.super__Vector_impl_data._M_start[pfVar7->variable_index].
                  in_greater_constraints;
        iVar4._M_current =
             *(pointer *)
              ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8);
        if (iVar4._M_current ==
            *(pointer *)
             ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)pvVar1,iVar4,&local_54);
        }
        else {
          *iVar4._M_current = local_54;
          *(int **)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) =
               iVar4._M_current + 1;
        }
      }
      local_54 = local_54 + 1;
    } while (local_54 != iVar6);
    ppVar5 = this->pb;
  }
  local_58 = 0;
  iVar6 = (int)((ulong)((long)(ppVar5->less_constraints).
                              super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ppVar5->less_constraints).
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  if (iVar6 != 0) {
    do {
      pcVar2 = (this->pb->less_constraints).
               super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar3 = *(pointer *)
                ((long)&pcVar2[local_58].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      for (pfVar7 = pcVar2[local_58].elements.
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start; pfVar7 != pfVar3; pfVar7 = pfVar7 + 1
          ) {
        pvVar1 = &(this_00->
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  )._M_impl.super__Vector_impl_data._M_start[pfVar7->variable_index].
                  in_less_constraints;
        iVar4._M_current =
             *(pointer *)
              ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8);
        if (iVar4._M_current ==
            *(pointer *)
             ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)pvVar1,iVar4,&local_58);
        }
        else {
          *iVar4._M_current = local_58;
          *(int **)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) =
               iVar4._M_current + 1;
        }
      }
      local_58 = local_58 + 1;
    } while (local_58 != iVar6);
  }
  return;
}

Assistant:

explicit preprocessor(const bx::context& ctx_, const Problem& pb_)
      : ctx(ctx_)
      , pb(pb_)
      , equal_constraints(pb.equal_constraints.size())
      , greater_constraints(pb.greater_constraints.size())
      , less_constraints(pb.less_constraints.size())
      , cache(pb.vars.values.size())
    {
        // The cache stores for each variable, all constraint where element
        // variable is used.

        for (int i = 0, e = bx::length(pb.equal_constraints); i != e; ++i)
            for (const auto& elem : pb.equal_constraints[i].elements)
                cache[elem.variable_index].in_equal_constraints.emplace_back(
                  i);

        for (int i = 0, e = bx::length(pb.greater_constraints); i != e; ++i)
            for (const auto& elem : pb.greater_constraints[i].elements)
                cache[elem.variable_index].in_greater_constraints.emplace_back(
                  i);

        for (int i = 0, e = bx::length(pb.less_constraints); i != e; ++i)
            for (const auto& elem : pb.less_constraints[i].elements)
                cache[elem.variable_index].in_less_constraints.emplace_back(i);
    }